

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scpserver.c
# Opt level: O0

void scp_sink_coroutine(ScpSink *scp)

{
  char cVar1;
  SftpServer *srv;
  uint64_t offset;
  SshChannel *c;
  bool bVar2;
  int iVar3;
  uint uVar4;
  ulonglong uVar5;
  ulong uVar6;
  size_t sVar7;
  char *pcVar8;
  size_t len;
  ptrlen pVar9;
  void *local_d8;
  size_t local_d0;
  ptrlen cmd_pl;
  void *local_a8;
  ulong local_a0;
  uint64_t remaining;
  uint64_t this_len;
  ptrlen data_1;
  size_t local_70;
  ptrlen leafname;
  char *p;
  char *q;
  unsigned_long dummy2;
  unsigned_long dummy1;
  char *newline;
  char *cdata;
  ptrlen data;
  int *crLine;
  ScpSink *scp_local;
  
  data.len = (size_t)&scp->crState;
  iVar3 = scp->crState;
  if (iVar3 == 0) goto LAB_001123b0;
  if (iVar3 == 0x439) goto LAB_001123e2;
  if (iVar3 == 0x4a3) goto LAB_001129f7;
  if (iVar3 == 0x4c0) {
    do {
      if (((scp->input_eof & 1U) == 0) && (sVar7 = bufchain_size(&scp->data), sVar7 == 0)) {
        return;
      }
      if ((scp->input_eof & 1U) != 0) {
        sftpsrv_close(scp->sf,&(scp->reply).srb,(scp->reply).handle);
        goto LAB_00112d30;
      }
      bufchain_consume(&scp->data,1);
LAB_001123b0:
      sshfwd_write(scp->sc,"",1);
      strbuf_clear(scp->command);
      do {
        *(undefined4 *)data.len = 0x439;
LAB_001123e2:
        if (((scp->input_eof & 1U) == 0) && (sVar7 = bufchain_size(&scp->data), sVar7 == 0)) {
          return;
        }
        if ((scp->input_eof & 1U) != 0) goto LAB_00112d30;
        _cdata = bufchain_prefix(&scp->data);
        newline = cdata;
        dummy1 = (unsigned_long)memchr(cdata,10,(size_t)data.ptr);
        if ((void *)dummy1 != (void *)0x0) {
          data.ptr = (void *)(long)(((int)dummy1 + 1) - (int)newline);
        }
        BinarySink_put_data(scp->command->binarysink_,newline,(size_t)data.ptr);
        bufchain_consume(&scp->data,(size_t)data.ptr);
      } while (dummy1 == 0);
      strbuf_chomp(scp->command,'\n');
      if (scp->command->len == 0) {
        cVar1 = '\0';
      }
      else {
        cVar1 = *scp->command->s;
      }
      scp->command_chr = cVar1;
      if (scp->command_chr == 'T') {
        iVar3 = __isoc99_sscanf(scp->command->s,"T%lu %lu %lu %lu",&scp->mtime,&dummy2,&scp->atime,
                                &q);
        if (iVar3 == 4) {
          scp->got_file_times = true;
          goto LAB_001123b0;
        }
LAB_00112cbd:
        pVar9 = ptrlen_from_strbuf(scp->command);
        local_d8 = pVar9.ptr;
        local_d0 = pVar9.len;
        uVar4 = string_length_for_printf(local_d0);
        pcVar8 = dupprintf("unrecognised scp command \'%.*s\'",(ulong)uVar4,local_d8);
        scp->errmsg = pcVar8;
        goto LAB_00112d30;
      }
      if ((scp->command_chr != 'C') && (scp->command_chr != 'D')) {
        if (scp->command_chr != 'E') goto LAB_00112cbd;
        if (scp->head == (ScpSinkStackEntry *)0x0) {
          pcVar8 = dupstr("received E command without matching D");
          scp->errmsg = pcVar8;
          goto LAB_00112d30;
        }
        scp_sink_pop(scp);
        scp->got_file_times = false;
        goto LAB_001123b0;
      }
      pcVar8 = scp->command->s;
      (scp->attrs).flags = 4;
      (scp->attrs).permissions = 0;
      while( true ) {
        leafname.len = (long)pcVar8 + 1;
        bVar2 = false;
        if ('/' < *(char *)leafname.len) {
          bVar2 = *(char *)leafname.len < '8';
        }
        if (!bVar2) break;
        (scp->attrs).permissions =
             (scp->attrs).permissions * 8 + (long)(*(char *)leafname.len + -0x30);
        pcVar8 = (char *)leafname.len;
      }
      if (*(char *)leafname.len != ' ') goto LAB_00112cbd;
      leafname.len = (size_t)(pcVar8 + 2);
      while( true ) {
        bVar2 = false;
        if ('/' < *(char *)leafname.len) {
          bVar2 = *(char *)leafname.len < ':';
        }
        if (!bVar2) break;
        leafname.len = leafname.len + 1;
      }
      if (*(char *)leafname.len != ' ') goto LAB_00112cbd;
      uVar5 = strtoull(pcVar8 + 2,(char **)0x0,10);
      scp->file_size = uVar5;
      pVar9 = make_ptrlen((void *)(leafname.len + 1),
                          scp->command->len - ((long)(leafname.len + 1) - (long)scp->command->s));
      strbuf_clear(scp->filename_sb);
      BinarySink_put_datapl(scp->filename_sb->binarysink_,scp->head->destpath);
      if ((scp->head->isdir & 1U) != 0) {
        if ((scp->filename_sb->len != 0) && (scp->filename_sb->s[scp->filename_sb->len - 1] != '/'))
        {
          BinarySink_put_byte(scp->filename_sb->binarysink_,'/');
        }
        BinarySink_put_datapl(scp->filename_sb->binarysink_,pVar9);
      }
      pVar9 = ptrlen_from_strbuf(scp->filename_sb);
      data_1.len = (size_t)pVar9.ptr;
      (scp->filename).ptr = (void *)data_1.len;
      local_70 = pVar9.len;
      (scp->filename).len = local_70;
      if ((scp->got_file_times & 1U) != 0) {
        (scp->attrs).mtime = scp->mtime;
        (scp->attrs).atime = scp->atime;
        (scp->attrs).flags = (scp->attrs).flags | 8;
      }
      scp->got_file_times = false;
      if (scp->command_chr == 'D') {
        sftpsrv_mkdir(scp->sf,&(scp->reply).srb,scp->filename,scp->attrs);
        if (((scp->reply).err & 1U) != 0) {
          uVar4 = string_length_for_printf((scp->filename).len);
          pcVar8 = dupprintf("\'%.*s\': unable to create directory: %s",(ulong)uVar4,
                             (scp->filename).ptr,(scp->reply).errmsg);
          scp->errmsg = pcVar8;
          goto LAB_00112d30;
        }
        scp_sink_push(scp,scp->filename,true);
        goto LAB_001123b0;
      }
      sftpsrv_open(scp->sf,&(scp->reply).srb,scp->filename,0x1a,scp->attrs);
      if (((scp->reply).err & 1U) != 0) goto code_r0x00112967;
      sshfwd_write(scp->sc,"",1);
      scp->file_offset = 0;
      while (scp->file_offset < scp->file_size) {
        *(undefined4 *)data.len = 0x4a3;
LAB_001129f7:
        if (((scp->input_eof & 1U) == 0) && (sVar7 = bufchain_size(&scp->data), sVar7 == 0)) {
          return;
        }
        if ((scp->input_eof & 1U) != 0) {
          sftpsrv_close(scp->sf,&(scp->reply).srb,(scp->reply).handle);
          goto LAB_00112d30;
        }
        pVar9 = bufchain_prefix(&scp->data);
        local_a8 = pVar9.ptr;
        local_a0 = pVar9.len;
        remaining = local_a0;
        uVar6 = scp->file_size - scp->file_offset;
        if (uVar6 < local_a0) {
          remaining = uVar6;
        }
        srv = scp->sf;
        offset = scp->file_offset;
        pVar9 = make_ptrlen(local_a8,remaining);
        sftpsrv_write(srv,&(scp->reply).srb,(scp->reply).handle,offset,pVar9);
        if (((scp->reply).err & 1U) != 0) {
          uVar4 = string_length_for_printf((scp->filename).len);
          pcVar8 = dupprintf("\'%.*s\': unable to write to file: %s",(ulong)uVar4,
                             (scp->filename).ptr,(scp->reply).errmsg);
          scp->errmsg = pcVar8;
          goto LAB_00112d30;
        }
        bufchain_consume(&scp->data,remaining);
        scp->file_offset = remaining + scp->file_offset;
      }
      *(undefined4 *)data.len = 0x4c0;
    } while( true );
  }
  if (iVar3 != 0x4e8) {
    *(int *)data.len = 0;
    return;
  }
LAB_00112df0:
  *(undefined4 *)data.len = 0x4e8;
  return;
code_r0x00112967:
  uVar4 = string_length_for_printf((scp->filename).len);
  pcVar8 = dupprintf("\'%.*s\': unable to open file: %s",(ulong)uVar4,(scp->filename).ptr,
                     (scp->reply).errmsg);
  scp->errmsg = pcVar8;
LAB_00112d30:
  if (scp->errmsg == (char *)0x0) {
    sshfwd_send_exit_status(scp->sc,0);
  }
  else {
    c = scp->sc;
    pcVar8 = scp->errmsg;
    len = strlen(scp->errmsg);
    sshfwd_write_ext(c,true,pcVar8,len);
    sshfwd_write_ext(scp->sc,true,"\n",1);
    sshfwd_send_exit_status(scp->sc,1);
  }
  sshfwd_write_eof(scp->sc);
  sshfwd_initiate_close(scp->sc,scp->errmsg);
  goto LAB_00112df0;
}

Assistant:

static void scp_sink_coroutine(ScpSink *scp)
{
    crBegin(scp->crState);

    while (1) {
        /*
         * Send an ack, and read a command.
         */
        sshfwd_write(scp->sc, "\0", 1);
        strbuf_clear(scp->command);
        while (1) {
            crMaybeWaitUntilV(scp->input_eof || bufchain_size(&scp->data) > 0);
            if (scp->input_eof)
                goto done;

            ptrlen data = bufchain_prefix(&scp->data);
            const char *cdata = data.ptr;
            const char *newline = memchr(cdata, '\012', data.len);
            if (newline)
                data.len = (int)(newline+1 - cdata);
            put_data(scp->command, cdata, data.len);
            bufchain_consume(&scp->data, data.len);

            if (newline)
                break;
        }

        /*
         * Parse the command.
         */
        strbuf_chomp(scp->command, '\n');
        scp->command_chr = scp->command->len > 0 ? scp->command->s[0] : '\0';
        if (scp->command_chr == 'T') {
            unsigned long dummy1, dummy2;
            if (sscanf(scp->command->s, "T%lu %lu %lu %lu",
                       &scp->mtime, &dummy1, &scp->atime, &dummy2) != 4)
                goto parse_error;
            scp->got_file_times = true;
        } else if (scp->command_chr == 'C' || scp->command_chr == 'D') {
            /*
             * Common handling of the start of this case, because the
             * messages are parsed similarly. We diverge later.
             */
            const char *q, *p = scp->command->s + 1; /* skip the 'C' */

            scp->attrs.flags = SSH_FILEXFER_ATTR_PERMISSIONS;
            scp->attrs.permissions = 0;
            while (*p >= '0' && *p <= '7') {
                scp->attrs.permissions =
                    scp->attrs.permissions * 8 + (*p - '0');
                p++;
            }
            if (*p != ' ')
                goto parse_error;
            p++;

            q = p;
            while (*p >= '0' && *p <= '9')
                p++;
            if (*p != ' ')
                goto parse_error;
            p++;
            scp->file_size = strtoull(q, NULL, 10);

            ptrlen leafname = make_ptrlen(
                p, scp->command->len - (p - scp->command->s));
            strbuf_clear(scp->filename_sb);
            put_datapl(scp->filename_sb, scp->head->destpath);
            if (scp->head->isdir) {
                if (scp->filename_sb->len > 0 &&
                    scp->filename_sb->s[scp->filename_sb->len-1]
                    != '/')
                    put_byte(scp->filename_sb, '/');
                put_datapl(scp->filename_sb, leafname);
            }
            scp->filename = ptrlen_from_strbuf(scp->filename_sb);

            if (scp->got_file_times) {
                scp->attrs.mtime = scp->mtime;
                scp->attrs.atime = scp->atime;
                scp->attrs.flags |= SSH_FILEXFER_ATTR_ACMODTIME;
            }
            scp->got_file_times = false;

            if (scp->command_chr == 'D') {
                sftpsrv_mkdir(scp->sf, &scp->reply.srb,
                              scp->filename, scp->attrs);

                if (scp->reply.err) {
                    scp->errmsg = dupprintf(
                        "'%.*s': unable to create directory: %s",
                        PTRLEN_PRINTF(scp->filename), scp->reply.errmsg);
                    goto done;
                }

                scp_sink_push(scp, scp->filename, true);
            } else {
                sftpsrv_open(scp->sf, &scp->reply.srb, scp->filename,
                             SSH_FXF_WRITE | SSH_FXF_CREAT | SSH_FXF_TRUNC,
                             scp->attrs);
                if (scp->reply.err) {
                    scp->errmsg = dupprintf(
                        "'%.*s': unable to open file: %s",
                        PTRLEN_PRINTF(scp->filename), scp->reply.errmsg);
                    goto done;
                }

                /*
                 * Now send an ack, and read the file data.
                 */
                sshfwd_write(scp->sc, "\0", 1);
                scp->file_offset = 0;
                while (scp->file_offset < scp->file_size) {
                    ptrlen data;
                    uint64_t this_len, remaining;

                    crMaybeWaitUntilV(
                        scp->input_eof || bufchain_size(&scp->data) > 0);
                    if (scp->input_eof) {
                        sftpsrv_close(scp->sf, &scp->reply.srb,
                                      scp->reply.handle);
                        goto done;
                    }

                    data = bufchain_prefix(&scp->data);
                    this_len = data.len;
                    remaining = scp->file_size - scp->file_offset;
                    if (this_len > remaining)
                        this_len = remaining;
                    sftpsrv_write(scp->sf, &scp->reply.srb,
                                  scp->reply.handle, scp->file_offset,
                                  make_ptrlen(data.ptr, this_len));
                    if (scp->reply.err) {
                        scp->errmsg = dupprintf(
                            "'%.*s': unable to write to file: %s",
                            PTRLEN_PRINTF(scp->filename), scp->reply.errmsg);
                        goto done;
                    }
                    bufchain_consume(&scp->data, this_len);
                    scp->file_offset += this_len;
                }

                /*
                 * Wait for the trailing NUL byte.
                 */
                crMaybeWaitUntilV(
                    scp->input_eof || bufchain_size(&scp->data) > 0);
                if (scp->input_eof) {
                    sftpsrv_close(scp->sf, &scp->reply.srb,
                                  scp->reply.handle);
                    goto done;
                }
                bufchain_consume(&scp->data, 1);
            }
        } else if (scp->command_chr == 'E') {
            if (!scp->head) {
                scp->errmsg = dupstr("received E command without matching D");
                goto done;
            }
            scp_sink_pop(scp);
            scp->got_file_times = false;
        } else {
            ptrlen cmd_pl;

            /*
             * Also come here if any of the above cases run into
             * parsing difficulties.
             */
          parse_error:
            cmd_pl = ptrlen_from_strbuf(scp->command);
            scp->errmsg = dupprintf("unrecognised scp command '%.*s'",
                                    PTRLEN_PRINTF(cmd_pl));
            goto done;
        }
    }

  done:
    if (scp->errmsg) {
        sshfwd_write_ext(scp->sc, true, scp->errmsg, strlen(scp->errmsg));
        sshfwd_write_ext(scp->sc, true, "\012", 1);
        sshfwd_send_exit_status(scp->sc, 1);
    } else {
        sshfwd_send_exit_status(scp->sc, 0);
    }
    sshfwd_write_eof(scp->sc);
    sshfwd_initiate_close(scp->sc, scp->errmsg);
    while (1) crReturnV;

    crFinishV;
}